

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::GenerateHashCode
          (ImmutableMapFieldLiteGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableMapFieldLiteGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (!internalGet$capitalized_name$().isEmpty()) {\n  hash = (37 * hash) + $constant_name$;\n  hash = (53 * hash) + internalGet$capitalized_name$().hashCode();\n}\n"
                    );
  return;
}

Assistant:

void ImmutableMapFieldLiteGenerator::
GenerateHashCode(io::Printer* printer) const {
  printer->Print(
      variables_,
      "if (!internalGet$capitalized_name$().isEmpty()) {\n"
      "  hash = (37 * hash) + $constant_name$;\n"
      "  hash = (53 * hash) + internalGet$capitalized_name$().hashCode();\n"
      "}\n");
}